

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.h
# Opt level: O0

void __thiscall
soplex::SPxParMultPR<double>::SPxParMultPR(SPxParMultPR<double> *this,SPxParMultPR<double> *old)

{
  Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *in_RSI;
  SPxPricer<double> *in_RDI;
  SPxPricer<double> *unaff_retaddr;
  Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *in_stack_ffffffffffffffe8;
  
  SPxPricer<double>::SPxPricer(unaff_retaddr,in_RDI);
  in_RDI->_vptr_SPxPricer = (_func_int **)&PTR_getName_00898dc8;
  Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::Array(in_RSI,in_stack_ffffffffffffffe8);
  *(undefined4 *)&in_RDI[1].thetolerance =
       *(undefined4 *)
        &in_RSI[3].data.
         super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  *(undefined4 *)((long)&in_RDI[1].thetolerance + 4) =
       *(undefined4 *)
        ((long)&in_RSI[3].data.
                super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
                ._M_impl.super__Vector_impl_data._M_finish + 4);
  *(undefined4 *)
   &in_RDI[1]._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = *(undefined4 *)
          &in_RSI[3].data.
           super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  *(undefined4 *)
   ((long)&in_RDI[1]._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr + 4) =
       *(undefined4 *)
        ((long)&in_RSI[3].data.
                super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  *(undefined4 *)
   &in_RDI[1]._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
       *(undefined4 *)
        &in_RSI[4].data.
         super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
         ._M_impl.super__Vector_impl_data._M_start;
  return;
}

Assistant:

SPxParMultPR(const SPxParMultPR& old)
      : SPxPricer<R>(old)
      , pricSet(old.pricSet)
      , multiParts(old.multiParts)
      , used(old.used)
      , min(old.min)
      , last(old.last)
      , partialSize(old.partialSize)
   {}